

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aom_convolve.c
# Opt level: O0

void highbd_convolve_vert
               (uint8_t *src8,ptrdiff_t src_stride,uint8_t *dst8,ptrdiff_t dst_stride,
               InterpKernel *y_filters,int y0_q4,int y_step_q4,int w,int h,int bd)

{
  uint16_t uVar1;
  int bd_00;
  int16_t *b;
  long in_RCX;
  long in_RDX;
  long in_RSI;
  long in_RDI;
  long in_R8;
  uint in_R9D;
  int sum;
  int16_t *y_filter;
  uint16_t *src_y;
  int in_stack_00000018;
  int y;
  int y_q4;
  int x;
  uint16_t *dst;
  uint16_t *src;
  undefined4 local_4c;
  undefined4 local_48;
  undefined4 local_44;
  undefined8 local_40;
  undefined8 local_38;
  
  local_40 = in_RDX << 1;
  local_38 = in_RDI * 2 + in_RSI * -6;
  for (local_44 = 0; local_44 < (int)src_y; local_44 = local_44 + 1) {
    local_48 = in_R9D;
    for (local_4c = 0; local_4c < in_stack_00000018; local_4c = local_4c + 1) {
      b = (int16_t *)(in_R8 + (long)(int)(local_48 & 0xf) * 0x10);
      bd_00 = highbd_vert_scalar_product
                        ((uint16_t *)(local_38 + ((int)local_48 >> 4) * in_RSI * 2),in_RSI,b);
      uVar1 = clip_pixel_highbd((int)b,bd_00);
      *(uint16_t *)(local_40 + local_4c * in_RCX * 2) = uVar1;
      local_48 = (int)y_filter + local_48;
    }
    local_38 = local_38 + 2;
    local_40 = local_40 + 2;
  }
  return;
}

Assistant:

static void highbd_convolve_vert(const uint8_t *src8, ptrdiff_t src_stride,
                                 uint8_t *dst8, ptrdiff_t dst_stride,
                                 const InterpKernel *y_filters, int y0_q4,
                                 int y_step_q4, int w, int h, int bd) {
  uint16_t *src = CONVERT_TO_SHORTPTR(src8);
  uint16_t *dst = CONVERT_TO_SHORTPTR(dst8);
  src -= src_stride * (SUBPEL_TAPS / 2 - 1);
  for (int x = 0; x < w; ++x) {
    int y_q4 = y0_q4;
    for (int y = 0; y < h; ++y) {
      const uint16_t *src_y = &src[(y_q4 >> SUBPEL_BITS) * src_stride];
      const int16_t *const y_filter = y_filters[y_q4 & SUBPEL_MASK];
      const int sum = highbd_vert_scalar_product(src_y, src_stride, y_filter);
      dst[y * dst_stride] =
          clip_pixel_highbd(ROUND_POWER_OF_TWO(sum, FILTER_BITS), bd);
      y_q4 += y_step_q4;
    }
    ++src;
    ++dst;
  }
}